

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O0

void __thiscall
re2c::Linear::used_labels
          (Linear *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  size_type sVar1;
  reference pvVar2;
  uint local_1c;
  uint32_t i;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_local;
  Linear *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
            ::size(&this->branches);
    if (sVar1 <= local_1c) break;
    pvVar2 = std::
             vector<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ::operator[](&this->branches,(ulong)local_1c);
    std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::insert
              (used,&pvVar2->second->label);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Linear::used_labels (std::set<label_t> & used)
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		used.insert (branches[i].second->label);
	}
}